

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_sign(void)

{
  int iVar1;
  uchar aux_rand [32];
  secp256k1_schnorrsig_extraparams extraparams;
  uchar zeros64 [64];
  uchar sig2 [64];
  uchar sig [64];
  uchar msg [32];
  secp256k1_keypair keypair;
  secp256k1_xonly_pubkey pk;
  uchar sk [32];
  secp256k1_keypair *in_stack_fffffffffffffe18;
  uchar *in_stack_fffffffffffffe20;
  secp256k1_keypair *in_stack_fffffffffffffe28;
  secp256k1_context *in_stack_fffffffffffffe30;
  secp256k1_keypair *in_stack_fffffffffffffe38;
  secp256k1_context *ctx;
  uchar *msg_00;
  uchar *sig64;
  secp256k1_context *in_stack_fffffffffffffe58;
  secp256k1_keypair *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe80;
  secp256k1_context *in_stack_fffffffffffffe88;
  uchar *in_stack_fffffffffffffe98;
  secp256k1_keypair *in_stack_fffffffffffffea0;
  secp256k1_context *in_stack_fffffffffffffea8;
  undefined1 local_128 [64];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  
  local_e8 = 0x2073692073696874;
  local_e0 = 0x6f662067736d2061;
  local_d8 = 0x6e68637320612072;
  local_d0 = 0x2e2e67697372726f;
  memset(&stack0xfffffffffffffe58,0,0x40);
  ctx = (secp256k1_context *)0x8cb36fda;
  msg_00 = (uchar *)0x0;
  sig64 = (uchar *)0x0;
  testrand256(in_stack_fffffffffffffe20);
  testrand256(in_stack_fffffffffffffe20);
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x332,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk)");
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x333,"test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair)");
    abort();
  }
  iVar1 = secp256k1_schnorrsig_sign32
                    (ctx,in_stack_fffffffffffffe38->data,(uchar *)in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x334,
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, NULL) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_schnorrsig_verify
                    ((secp256k1_context *)zeros64._56_8_,(uchar *)zeros64._48_8_,
                     (uchar *)zeros64._40_8_,zeros64._32_8_,(secp256k1_xonly_pubkey *)zeros64._24_8_
                    );
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x335,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk)");
    abort();
  }
  iVar1 = secp256k1_schnorrsig_sign
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28->data,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(uchar *)0x156f10);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x337,
            "test condition failed: secp256k1_schnorrsig_sign(CTX, sig2, msg, &keypair, NULL) == 1")
    ;
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_128,&stack0xfffffffffffffe98,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x338,"test condition failed: secp256k1_memcmp_var(sig, sig2, sizeof(sig)) == 0");
    abort();
  }
  iVar1 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffe58,sig64,msg_00,(size_t)ctx,in_stack_fffffffffffffe38,
                     (secp256k1_schnorrsig_extraparams *)in_stack_fffffffffffffe30);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x33b,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_schnorrsig_verify
                    ((secp256k1_context *)zeros64._56_8_,(uchar *)zeros64._48_8_,
                     (uchar *)zeros64._40_8_,zeros64._32_8_,(secp256k1_xonly_pubkey *)zeros64._24_8_
                    );
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x33c,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk)");
    abort();
  }
  memset(local_128,1,0x40);
  iVar1 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffe58,sig64,(uchar *)nonce_function_failing,(size_t)ctx,
                     in_stack_fffffffffffffe38,
                     (secp256k1_schnorrsig_extraparams *)in_stack_fffffffffffffe30);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x33f,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_128,&stack0xfffffffffffffe58,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x340,"test condition failed: secp256k1_memcmp_var(sig, zeros64, sizeof(sig)) == 0");
    abort();
  }
  memset(local_128,1,0x40);
  iVar1 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffe58,sig64,(uchar *)nonce_function_0,(size_t)ctx,
                     in_stack_fffffffffffffe38,
                     (secp256k1_schnorrsig_extraparams *)in_stack_fffffffffffffe30);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x343,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_128,&stack0xfffffffffffffe58,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x344,"test condition failed: secp256k1_memcmp_var(sig, zeros64, sizeof(sig)) == 0");
    abort();
  }
  memset(local_128,1,0x40);
  iVar1 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffe58,sig64,(uchar *)nonce_function_overflowing,(size_t)ctx
                     ,in_stack_fffffffffffffe38,
                     (secp256k1_schnorrsig_extraparams *)in_stack_fffffffffffffe30);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x347,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_schnorrsig_verify
                    ((secp256k1_context *)zeros64._56_8_,(uchar *)zeros64._48_8_,
                     (uchar *)zeros64._40_8_,zeros64._32_8_,(secp256k1_xonly_pubkey *)zeros64._24_8_
                    );
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x348,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk)");
    abort();
  }
  iVar1 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffe58,&stack0xfffffffffffffe18,(uchar *)0x0,(size_t)ctx,
                     in_stack_fffffffffffffe38,
                     (secp256k1_schnorrsig_extraparams *)in_stack_fffffffffffffe30);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x34e,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_schnorrsig_sign32
                    (ctx,in_stack_fffffffffffffe38->data,(uchar *)in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x34f,
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig2, msg, &keypair, extraparams.ndata) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_128,&stack0xfffffffffffffe98,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x350,"test condition failed: secp256k1_memcmp_var(sig, sig2, sizeof(sig)) == 0");
    abort();
  }
  return;
}

Assistant:

static void test_schnorrsig_sign(void) {
    unsigned char sk[32];
    secp256k1_xonly_pubkey pk;
    secp256k1_keypair keypair;
    const unsigned char msg[] = {'t', 'h', 'i', 's', ' ', 'i', 's', ' ', 'a', ' ', 'm', 's', 'g', ' ', 'f', 'o', 'r', ' ', 'a', ' ', 's', 'c', 'h', 'n', 'o', 'r', 'r', 's', 'i', 'g', '.', '.'};
    unsigned char sig[64];
    unsigned char sig2[64];
    unsigned char zeros64[64] = { 0 };
    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;
    unsigned char aux_rand[32];

    testrand256(sk);
    testrand256(aux_rand);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair));
    CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, NULL) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk));
    /* Check that deprecated alias gives the same result */
    CHECK(secp256k1_schnorrsig_sign(CTX, sig2, msg, &keypair, NULL) == 1);
    CHECK(secp256k1_memcmp_var(sig, sig2, sizeof(sig)) == 0);

    /* Test different nonce functions */
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk));
    memset(sig, 1, sizeof(sig));
    extraparams.noncefp = nonce_function_failing;
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 0);
    CHECK(secp256k1_memcmp_var(sig, zeros64, sizeof(sig)) == 0);
    memset(&sig, 1, sizeof(sig));
    extraparams.noncefp = nonce_function_0;
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 0);
    CHECK(secp256k1_memcmp_var(sig, zeros64, sizeof(sig)) == 0);
    memset(&sig, 1, sizeof(sig));
    extraparams.noncefp = nonce_function_overflowing;
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk));

    /* When using the default nonce function, schnorrsig_sign_custom produces
     * the same result as schnorrsig_sign with aux_rand = extraparams.ndata */
    extraparams.noncefp = NULL;
    extraparams.ndata = aux_rand;
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1);
    CHECK(secp256k1_schnorrsig_sign32(CTX, sig2, msg, &keypair, extraparams.ndata) == 1);
    CHECK(secp256k1_memcmp_var(sig, sig2, sizeof(sig)) == 0);
}